

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTexture2CommitmentTestCase::writeDataToTexture
          (SparseTexture2CommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  glUseProgramFunc p_Var1;
  undefined *__s;
  undefined4 sample_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  GLenum GVar5;
  deUint32 dVar6;
  ostream *poVar7;
  TestError *this_00;
  uchar *ptr;
  GLchar *pGVar8;
  RenderContext *renderCtx;
  ShaderInfo *pSVar9;
  char *pcVar10;
  undefined1 local_410 [8];
  ShaderProgram program;
  undefined1 local_318 [8];
  ProgramSources sources;
  string local_240;
  allocator<char> local_219;
  string local_218;
  undefined1 local_1f8 [8];
  TokenStrings s;
  undefined1 local_b0 [8];
  string shader;
  GLint sample;
  GLubyte *data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecData;
  GLuint local_60;
  GLint texSize;
  GLint depth;
  GLint height;
  GLint width;
  TransferFormat local_4c;
  TransferFormat transferFormat;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTexture2CommitmentTestCase *this_local;
  
  poVar7 = std::operator<<((ostream *)&(this->super_SparseTextureCommitmentTestCase).field_0x88,
                           "Fill Texture [level: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,level);
  std::operator<<(poVar7,"] - ");
  if (level <= (this->super_SparseTextureCommitmentTestCase).mState.levels + -1) {
    _height = (this->super_SparseTextureCommitmentTestCase).mState.format;
    local_4c = glu::getTransferFormat(_height);
    SparseTextureUtils::getTextureLevelSize
              (target,&(this->super_SparseTextureCommitmentTestCase).mState,level,&depth,&texSize,
               (GLint *)&local_60);
    if (((0 < depth) && (0 < texSize)) &&
       ((this->super_SparseTextureCommitmentTestCase).mState.minDepth <= (int)local_60)) {
      if (target == 0x8513) {
        local_60 = local_60 * 6;
      }
      iVar3 = depth * texSize * local_60;
      iVar4 = tcu::TextureFormat::getPixelSize
                        (&(this->super_SparseTextureCommitmentTestCase).mState.format);
      vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = iVar3 * iVar4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,
                 (long)vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
      ::deMemset(ptr,0xff,(long)vecData.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if ((target == 0x9100) || (target == 0x9102)) {
        for (shader.field_2._12_4_ = 0; __s = st2_compute_textureFill,
            (int)shader.field_2._12_4_ <
            (this->super_SparseTextureCommitmentTestCase).mState.samples;
            shader.field_2._12_4_ = shader.field_2._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_b0,__s,
                     (allocator<char> *)(s.sampleDef.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(s.sampleDef.field_2._M_local_buf + 0xf));
          sample_00 = shader.field_2._12_4_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_218,"image",&local_219);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_240,"image",(allocator<char> *)&sources.field_0xcf);
          createShaderTokens((TokenStrings *)local_1f8,this,target,format,sample_00,&local_218,
                             &local_240);
          std::__cxx11::string::~string((string *)&local_240);
          std::allocator<char>::~allocator((allocator<char> *)&sources.field_0xcf);
          std::__cxx11::string::~string((string *)&local_218);
          std::allocator<char>::~allocator(&local_219);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<INPUT_TYPE>",pGVar8,(string *)local_b0);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<POINT_TYPE>",pGVar8,(string *)local_b0);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<POINT_DEF>",pGVar8,(string *)local_b0);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<RETURN_TYPE>",pGVar8,(string *)local_b0);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<RESULT_EXPECTED>",pGVar8,(string *)local_b0);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<SAMPLE_DEF>",pGVar8,(string *)local_b0);
          glu::ProgramSources::ProgramSources((ProgramSources *)local_318);
          glu::ComputeSource::ComputeSource
                    ((ComputeSource *)&program.m_program.m_info.linkTimeUs,(string *)local_b0);
          glu::ProgramSources::operator<<
                    ((ProgramSources *)local_318,
                     (ShaderSource *)&program.m_program.m_info.linkTimeUs);
          glu::ComputeSource::~ComputeSource((ComputeSource *)&program.m_program.m_info.linkTimeUs);
          renderCtx = deqp::Context::getRenderContext
                                ((this->super_SparseTextureCommitmentTestCase).super_TestCase.
                                 m_context);
          glu::ShaderProgram::ShaderProgram
                    ((ShaderProgram *)local_410,renderCtx,(ProgramSources *)local_318);
          bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_410);
          if (bVar2) {
            p_Var1 = gl->useProgram;
            dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_410);
            (*p_Var1)(dVar6);
            GVar5 = (*gl->getError)();
            glu::checkError(GVar5,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x419);
            (*gl->bindImageTexture)(0,*texture,level,'\0',0,0x88b9,format);
            GVar5 = (*gl->getError)();
            glu::checkError(GVar5,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x41c);
            (*gl->uniform1i)(1,0);
            GVar5 = (*gl->getError)();
            glu::checkError(GVar5,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x41e);
            (*gl->dispatchCompute)(depth,texSize,local_60);
            GVar5 = (*gl->getError)();
            glu::checkError(GVar5,"glDispatchCompute",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x420);
            (*gl->memoryBarrier)(0xffffffff);
            GVar5 = (*gl->getError)();
            glu::checkError(GVar5,"glMemoryBarrier",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x422);
          }
          else {
            poVar7 = std::operator<<((ostream *)
                                     &(this->super_SparseTextureCommitmentTestCase).field_0x88,
                                     "Compute shader compilation failed (writing) for target: ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,target);
            poVar7 = std::operator<<(poVar7,", format: ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,format);
            poVar7 = std::operator<<(poVar7,", sample: ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,shader.field_2._12_4_);
            poVar7 = std::operator<<(poVar7,", infoLog: ");
            pSVar9 = glu::ShaderProgram::getShaderInfo
                               ((ShaderProgram *)local_410,SHADERTYPE_COMPUTE,0);
            poVar7 = std::operator<<(poVar7,(string *)&pSVar9->infoLog);
            poVar7 = std::operator<<(poVar7,", shaderSource: ");
            pcVar10 = (char *)std::__cxx11::string::c_str();
            poVar7 = std::operator<<(poVar7,pcVar10);
            std::operator<<(poVar7," - ");
          }
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_410);
          glu::ProgramSources::~ProgramSources((ProgramSources *)local_318);
          TokenStrings::~TokenStrings((TokenStrings *)local_1f8);
          std::__cxx11::string::~string((string *)local_b0);
        }
      }
      else {
        gl4cts::Texture::SubImage
                  (gl,target,level,0,0,0,depth,texSize,local_60,local_4c.format,local_4c.dataType,
                   ptr);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"SubImage",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x3fe);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    }
    return true;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
             ,0x3e4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool SparseTexture2CommitmentTestCase::writeDataToTexture(const Functions& gl, GLint target, GLint format,
														  GLuint& texture, GLint level)
{
	mLog << "Fill Texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (width > 0 && height > 0 && depth >= mState.minDepth)
	{
		if (target == GL_TEXTURE_CUBE_MAP)
			depth = depth * 6;

		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecData;
		vecData.resize(texSize);
		GLubyte* data = vecData.data();

		deMemset(data, 255, texSize);

		if (target != GL_TEXTURE_2D_MULTISAMPLE && target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
		{
			Texture::SubImage(gl, target, level, 0, 0, 0, width, height, depth, transferFormat.format,
							  transferFormat.dataType, (GLvoid*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "SubImage");
		}
		// For multisample texture use compute shader to store image data
		else
		{
			for (GLint sample = 0; sample < mState.samples; ++sample)
			{
				std::string shader = st2_compute_textureFill;

				// Adjust shader source to texture format
				TokenStrings s = createShaderTokens(target, format, sample);

				replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
				replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
				replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
				replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
				replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
				replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);

				ProgramSources sources;
				sources << ComputeSource(shader);

				// Build and run shader
				ShaderProgram program(m_context.getRenderContext(), sources);
				if (program.isOk())
				{
					gl.useProgram(program.getProgram());
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
					gl.bindImageTexture(0 /* unit */, texture, level /* level */, GL_FALSE /* layered */, 0 /* layer */,
										GL_WRITE_ONLY, format);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
					gl.uniform1i(1, 0 /* image_unit */);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
					gl.dispatchCompute(width, height, depth);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
					gl.memoryBarrier(GL_ALL_BARRIER_BITS);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");
				}
				else
				{
					mLog << "Compute shader compilation failed (writing) for target: " << target
						 << ", format: " << format << ", sample: " << sample
						 << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
						 << ", shaderSource: " << shader.c_str() << " - ";
				}
			}
		}
	}

	return true;
}